

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall
Model_removeAllComponentsImportedChild_Test::TestBody
          (Model_removeAllComponentsImportedChild_Test *this)

{
  char *pcVar1;
  unsigned_long local_80;
  unsigned_long local_78;
  AssertionResult gtest_ar;
  ModelPtr model;
  ComponentPtr c2;
  ComponentPtr c1;
  ImportSourcePtr import;
  
  libcellml::Model::create();
  std::__cxx11::string::string<std::allocator<char>>((string *)&import,"c1",(allocator<char> *)&c2);
  libcellml::Component::create((string *)&c1);
  std::__cxx11::string::~string((string *)&import);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&import,"c2",(allocator<char> *)&gtest_ar);
  libcellml::Component::create((string *)&c2);
  std::__cxx11::string::~string((string *)&import);
  libcellml::ImportSource::create();
  libcellml::ImportedEntity::setImportSource
            ((shared_ptr *)
             (c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10)
            );
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_80 = 2;
  local_78 = libcellml::ComponentEntity::componentCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(2)","model->componentCount()",&local_80,&local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x489,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::ComponentEntity::removeAllComponents();
  local_80 = 0;
  local_78 = libcellml::ComponentEntity::componentCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(0)","model->componentCount()",&local_80,&local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x48c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Model, removeAllComponentsImportedChild)
{
    auto model = libcellml::Model::create();
    auto c1 = libcellml::Component::create("c1");
    auto c2 = libcellml::Component::create("c2");
    auto import = libcellml::ImportSource::create();
    c2->setImportSource(import);
    model->addComponent(c2);
    model->addComponent(c1);
    EXPECT_EQ(size_t(2), model->componentCount());

    model->removeAllComponents();
    EXPECT_EQ(size_t(0), model->componentCount());
}